

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_im2col_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int64_t *ne,int s0,int s1,int p0,
                int p1,int d0,int d1,_Bool is_2D)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int32_t params [7];
  ggml_tensor *result;
  int in_stack_ffffffffffffffa8;
  ggml_type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  pgVar1 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(int64_t *)0x1502c9);
  ggml_set_op_params((ggml_tensor *)CONCAT44(params[4],params[2]),(void *)CONCAT44(in_R9D,in_R8D),
                     0x150324);
  pgVar1->op = GGML_OP_IM2COL_BACK;
  pgVar1->src[0] = in_RSI;
  pgVar1->src[1] = in_RDX;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_im2col_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int64_t             * ne,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1,
        bool                  is_2D) {
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);
    int32_t params[] = { s0, s1, p0, p1, d0, d1, (is_2D ? 1 : 0) };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_IM2COL_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}